

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareRepeatedRep
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *field;
  Message *message;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int v2;
  Reflection *this_00;
  Reflection *this_01;
  MapKeyComparator *key_comparator_00;
  LogMessage *pLVar7;
  reference pvVar8;
  undefined1 auVar9 [16];
  byte local_1ba;
  int local_194;
  int local_190;
  int i_2;
  int i_1;
  bool result;
  LogMessageFatal local_178 [23];
  Voidify local_161;
  string *local_160;
  string *absl_log_internal_check_op_result;
  int local_150;
  int j;
  int i;
  int next_unmatched_index;
  SpecificField specific_field;
  bool fieldDifferent;
  bool simple_list;
  bool smart_list;
  MapKeyComparator *key_comparator;
  vector<int,_std::allocator<int>_> match_list2;
  vector<int,_std::allocator<int>_> match_list1;
  bool treated_as_subset;
  int count2;
  int count1;
  Reflection *reflection2;
  Reflection *reflection1;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  LogMessageFatal local_58 [23];
  Voidify local_41;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *local_40;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *parent_fields_local;
  FieldDescriptor *repeated_field_local;
  Message *pMStack_28;
  int unpacked_any_local;
  Message *message2_local;
  Message *message1_local;
  MessageDifferencer *this_local;
  
  local_40 = parent_fields;
  parent_fields_local =
       (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        *)repeated_field;
  repeated_field_local._4_4_ = unpacked_any;
  pMStack_28 = message2;
  message2_local = message1;
  message1_local = (Message *)this;
  bVar1 = FieldDescriptor::is_repeated(repeated_field);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68,"repeated_field->is_repeated()");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
               ,0x4cf,local_68._M_len,local_68._M_str);
    pLVar7 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_58);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_41,pLVar7);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
  }
  this_00 = Message::GetReflection(message2_local);
  this_01 = Message::GetReflection(pMStack_28);
  iVar4 = Reflection::FieldSize(this_00,message2_local,(FieldDescriptor *)parent_fields_local);
  iVar5 = Reflection::FieldSize(this_01,pMStack_28,(FieldDescriptor *)parent_fields_local);
  bVar1 = IsTreatedAsSubset(this,(FieldDescriptor *)parent_fields_local);
  if (((iVar4 == iVar5) || (this->reporter_ != (Reporter *)0x0)) || (bVar1)) {
    if ((iVar5 < iVar4) && (this->reporter_ == (Reporter *)0x0)) {
      this_local._7_1_ = 0;
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 &match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&key_comparator);
      key_comparator_00 = GetMapKeyComparator(this,(FieldDescriptor *)parent_fields_local);
      bVar2 = IsTreatedAsSmartList(this,(FieldDescriptor *)parent_fields_local);
      local_1ba = 0;
      if (key_comparator_00 == (MapKeyComparator *)0x0) {
        bVar3 = IsTreatedAsSet(this,(FieldDescriptor *)parent_fields_local);
        local_1ba = 0;
        if (!bVar3) {
          bVar3 = IsTreatedAsSmartSet(this,(FieldDescriptor *)parent_fields_local);
          local_1ba = 0;
          if (!bVar3) {
            local_1ba = bVar2 ^ 0xff;
          }
        }
      }
      local_1ba = local_1ba & 1;
      if (((local_1ba != 0) ||
          (bVar3 = MatchRepeatedFieldIndices
                             (this,message2_local,pMStack_28,repeated_field_local._4_4_,
                              (FieldDescriptor *)parent_fields_local,key_comparator_00,local_40,
                              (vector<int,_std::allocator<int>_> *)
                              &match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<int,_std::allocator<int>_> *)&key_comparator), bVar3)) ||
         (this->reporter_ != (Reporter *)0x0)) {
        specific_field._95_1_ = 0;
        SpecificField::SpecificField((SpecificField *)&i);
        _i = message2_local;
        specific_field.message1 = pMStack_28;
        specific_field.message2._0_4_ = repeated_field_local._4_4_;
        specific_field._16_8_ = parent_fields_local;
        j = 0;
        for (local_150 = 0; (local_150 < iVar4 && ((local_1ba == 0 || (local_150 < iVar5))));
            local_150 = local_150 + 1) {
          if ((local_1ba == 0) &&
             (pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage,(long)local_150),
             *pvVar8 == -1)) {
            if (bVar2) {
              if (this->reporter_ == (Reporter *)0x0) {
                this_local._7_1_ = 0;
                goto LAB_005a70da;
              }
              AddSpecificIndex((SpecificField *)&i,message2_local,
                               (FieldDescriptor *)parent_fields_local,local_150);
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              ::push_back(local_40,(value_type *)&i);
              (*this->reporter_->_vptr_Reporter[3])
                        (this->reporter_,message2_local,pMStack_28,local_40);
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              ::pop_back(local_40);
              specific_field._95_1_ = 1;
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage,(long)local_150);
              *pvVar8 = -2;
            }
          }
          else {
            if (bVar2) {
              for (absl_log_internal_check_op_result._4_4_ = j;
                  iVar6 = absl_log_internal_check_op_result._4_4_,
                  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)
                                      &match_list2.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (long)local_150), iVar6 < *pvVar8;
                  absl_log_internal_check_op_result._4_4_ =
                       absl_log_internal_check_op_result._4_4_ + 1) {
                iVar6 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
                v2 = absl::lts_20240722::log_internal::GetReferenceableValue
                               (absl_log_internal_check_op_result._4_4_);
                local_160 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                                      (iVar6,v2,"0 <= j");
                if (local_160 != (string *)0x0) {
                  auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)local_160);
                  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                            (local_178,
                             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                             ,0x517,auVar9._0_8_,auVar9._8_8_);
                  pLVar7 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                                     ((LogMessage *)local_178);
                  absl::lts_20240722::log_internal::Voidify::operator&&(&local_161,pLVar7);
                  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_178);
                }
                if (this->reporter_ == (Reporter *)0x0) {
                  this_local._7_1_ = 0;
                  goto LAB_005a70da;
                }
                specific_field.unknown_field_number = absl_log_internal_check_op_result._4_4_;
                AddSpecificNewIndex((SpecificField *)&i,pMStack_28,
                                    (FieldDescriptor *)parent_fields_local,
                                    absl_log_internal_check_op_result._4_4_);
                std::
                vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                ::push_back(local_40,(value_type *)&i);
                (*this->reporter_->_vptr_Reporter[2])
                          (this->reporter_,message2_local,pMStack_28,local_40);
                std::
                vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                ::pop_back(local_40);
                specific_field._95_1_ = 1;
                pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)&key_comparator,
                                    (long)absl_log_internal_check_op_result._4_4_);
                *pvVar8 = -2;
              }
            }
            AddSpecificIndex((SpecificField *)&i,message2_local,
                             (FieldDescriptor *)parent_fields_local,local_150);
            message = pMStack_28;
            field = parent_fields_local;
            if (local_1ba == 0) {
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage,(long)local_150);
              AddSpecificNewIndex((SpecificField *)&i,message,(FieldDescriptor *)field,*pvVar8);
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage,(long)local_150);
              j = *pvVar8 + 1;
            }
            else {
              AddSpecificNewIndex((SpecificField *)&i,pMStack_28,
                                  (FieldDescriptor *)parent_fields_local,local_150);
            }
            bVar3 = CompareFieldValueUsingParentFields
                              (this,message2_local,pMStack_28,repeated_field_local._4_4_,
                               (FieldDescriptor *)parent_fields_local,local_150,
                               specific_field.unknown_field_type,local_40);
            if (bVar3) {
              if ((((this->reporter_ == (Reporter *)0x0) ||
                   (specific_field.unknown_field_number == specific_field.unknown_field_type)) ||
                  (bVar3 = FieldDescriptor::is_map((FieldDescriptor *)specific_field._16_8_), bVar3)
                  ) || ((this->report_moves_ & 1U) == 0)) {
                if (((this->report_matches_ & 1U) != 0) && (this->reporter_ != (Reporter *)0x0)) {
                  std::
                  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  ::push_back(local_40,(value_type *)&i);
                  (*this->reporter_->_vptr_Reporter[6])
                            (this->reporter_,message2_local,pMStack_28,local_40);
                  std::
                  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  ::pop_back(local_40);
                }
              }
              else {
                std::
                vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                ::push_back(local_40,(value_type *)&i);
                (*this->reporter_->_vptr_Reporter[5])
                          (this->reporter_,message2_local,pMStack_28,local_40);
                std::
                vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                ::pop_back(local_40);
              }
            }
            else {
              if (this->reporter_ == (Reporter *)0x0) {
                this_local._7_1_ = 0;
                goto LAB_005a70da;
              }
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              ::push_back(local_40,(value_type *)&i);
              (*this->reporter_->_vptr_Reporter[4])
                        (this->reporter_,message2_local,pMStack_28,local_40);
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              ::pop_back(local_40);
              specific_field._95_1_ = 1;
            }
          }
        }
        for (local_190 = 0; local_190 < iVar5; local_190 = local_190 + 1) {
          if (((local_1ba != 0) ||
              (pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)&key_comparator,
                                   (long)local_190), *pvVar8 == -1)) &&
             ((local_1ba == 0 || (iVar4 <= local_190)))) {
            if (!bVar1) {
              specific_field._95_1_ = 1;
            }
            if (this->reporter_ != (Reporter *)0x0) {
              specific_field.unknown_field_number = local_190;
              AddSpecificNewIndex((SpecificField *)&i,pMStack_28,
                                  (FieldDescriptor *)parent_fields_local,local_190);
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              ::push_back(local_40,(value_type *)&i);
              (*this->reporter_->_vptr_Reporter[2])
                        (this->reporter_,message2_local,pMStack_28,local_40);
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              ::pop_back(local_40);
            }
          }
        }
        for (local_194 = 0; local_194 < iVar4; local_194 = local_194 + 1) {
          if (((local_1ba != 0) ||
              (pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   &match_list2.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)local_194), *pvVar8 == -1)) &&
             ((local_1ba == 0 || (iVar5 <= local_194)))) {
            if (this->reporter_ == (Reporter *)0x0) {
              __assert_fail("reporter_ != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                            ,0x559,
                            "bool google::protobuf::util::MessageDifferencer::CompareRepeatedRep(const Message &, const Message &, int, const FieldDescriptor *, std::vector<SpecificField> *)"
                           );
            }
            AddSpecificIndex((SpecificField *)&i,message2_local,
                             (FieldDescriptor *)parent_fields_local,local_194);
            std::
            vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            ::push_back(local_40,(value_type *)&i);
            (*this->reporter_->_vptr_Reporter[3])
                      (this->reporter_,message2_local,pMStack_28,local_40);
            std::
            vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            ::pop_back(local_40);
            specific_field._95_1_ = 1;
          }
        }
        this_local._7_1_ = (specific_field._95_1_ ^ 0xff) & 1;
      }
      else {
        this_local._7_1_ = 0;
      }
LAB_005a70da:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&key_comparator);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MessageDifferencer::CompareRepeatedRep(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    std::vector<SpecificField>* parent_fields) {
  // the input FieldDescriptor is guaranteed to be repeated field.
  ABSL_DCHECK(repeated_field->is_repeated());
  const Reflection* reflection1 = message1.GetReflection();
  const Reflection* reflection2 = message2.GetReflection();

  const int count1 = reflection1->FieldSize(message1, repeated_field);
  const int count2 = reflection2->FieldSize(message2, repeated_field);
  const bool treated_as_subset = IsTreatedAsSubset(repeated_field);

  // If the field is not treated as subset and no detailed reports is needed,
  // we do a quick check on the number of the elements to avoid unnecessary
  // comparison.
  if (count1 != count2 && reporter_ == NULL && !treated_as_subset) {
    return false;
  }
  // A match can never be found if message1 has more items than message2.
  if (count1 > count2 && reporter_ == NULL) {
    return false;
  }

  // These two list are used for store the index of the correspondent
  // element in peer repeated field.
  std::vector<int> match_list1;
  std::vector<int> match_list2;

  const MapKeyComparator* key_comparator = GetMapKeyComparator(repeated_field);
  bool smart_list = IsTreatedAsSmartList(repeated_field);
  bool simple_list = key_comparator == nullptr &&
                     !IsTreatedAsSet(repeated_field) &&
                     !IsTreatedAsSmartSet(repeated_field) && !smart_list;

  // For simple lists, we avoid matching repeated field indices, saving the
  // memory allocations that would otherwise be needed for match_list1 and
  // match_list2.
  if (!simple_list) {
    // Try to match indices of the repeated fields. Return false if match fails.
    if (!MatchRepeatedFieldIndices(
            message1, message2, unpacked_any, repeated_field, key_comparator,
            *parent_fields, &match_list1, &match_list2) &&
        reporter_ == nullptr) {
      return false;
    }
  }

  bool fieldDifferent = false;
  SpecificField specific_field;
  specific_field.message1 = &message1;
  specific_field.message2 = &message2;
  specific_field.unpacked_any = unpacked_any;
  specific_field.field = repeated_field;

  // At this point, we have already matched pairs of fields (with the reporting
  // to be done later). Now to check if the paired elements are different.
  int next_unmatched_index = 0;
  for (int i = 0; i < count1; i++) {
    if (simple_list && i >= count2) {
      break;
    }
    if (!simple_list && match_list1[i] == -1) {
      if (smart_list) {
        if (reporter_ == nullptr) return false;
        AddSpecificIndex(&specific_field, message1, repeated_field, i);
        parent_fields->push_back(specific_field);
        reporter_->ReportDeleted(message1, message2, *parent_fields);
        parent_fields->pop_back();
        fieldDifferent = true;
        // Use -2 to mark this element has been reported.
        match_list1[i] = -2;
      }
      continue;
    }
    if (smart_list) {
      for (int j = next_unmatched_index; j < match_list1[i]; ++j) {
        ABSL_CHECK_LE(0, j);
        if (reporter_ == nullptr) return false;
        specific_field.index = j;
        AddSpecificNewIndex(&specific_field, message2, repeated_field, j);
        parent_fields->push_back(specific_field);
        reporter_->ReportAdded(message1, message2, *parent_fields);
        parent_fields->pop_back();
        fieldDifferent = true;
        // Use -2 to mark this element has been reported.
        match_list2[j] = -2;
      }
    }
    AddSpecificIndex(&specific_field, message1, repeated_field, i);
    if (simple_list) {
      AddSpecificNewIndex(&specific_field, message2, repeated_field, i);
    } else {
      AddSpecificNewIndex(&specific_field, message2, repeated_field,
                          match_list1[i]);
      next_unmatched_index = match_list1[i] + 1;
    }

    const bool result = CompareFieldValueUsingParentFields(
        message1, message2, unpacked_any, repeated_field, i,
        specific_field.new_index, parent_fields);

    // If we have found differences, either report them or terminate if
    // no reporter is present. Note that ReportModified, ReportMoved, and
    // ReportMatched are all mutually exclusive.
    if (!result) {
      if (reporter_ == NULL) return false;
      parent_fields->push_back(specific_field);
      reporter_->ReportModified(message1, message2, *parent_fields);
      parent_fields->pop_back();
      fieldDifferent = true;
    } else if (reporter_ != NULL &&
               specific_field.index != specific_field.new_index &&
               !specific_field.field->is_map() && report_moves_) {
      parent_fields->push_back(specific_field);
      reporter_->ReportMoved(message1, message2, *parent_fields);
      parent_fields->pop_back();
    } else if (report_matches_ && reporter_ != NULL) {
      parent_fields->push_back(specific_field);
      reporter_->ReportMatched(message1, message2, *parent_fields);
      parent_fields->pop_back();
    }
  }

  // Report any remaining additions or deletions.
  for (int i = 0; i < count2; ++i) {
    if (!simple_list && match_list2[i] != -1) continue;
    if (simple_list && i < count1) continue;
    if (!treated_as_subset) {
      fieldDifferent = true;
    }

    if (reporter_ == NULL) continue;
    specific_field.index = i;
    AddSpecificNewIndex(&specific_field, message2, repeated_field, i);
    parent_fields->push_back(specific_field);
    reporter_->ReportAdded(message1, message2, *parent_fields);
    parent_fields->pop_back();
  }

  for (int i = 0; i < count1; ++i) {
    if (!simple_list && match_list1[i] != -1) continue;
    if (simple_list && i < count2) continue;
    assert(reporter_ != NULL);
    AddSpecificIndex(&specific_field, message1, repeated_field, i);
    parent_fields->push_back(specific_field);
    reporter_->ReportDeleted(message1, message2, *parent_fields);
    parent_fields->pop_back();
    fieldDifferent = true;
  }
  return !fieldDifferent;
}